

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

uint get_max_prime(uint number)

{
  uint local_18;
  uint local_14;
  int j;
  uint i;
  uint number_local;
  
  local_14 = number;
  do {
    if (local_14 < 2) {
      return 2;
    }
    for (local_18 = 2; (local_18 < local_14 && (local_14 % local_18 != 0)); local_18 = local_18 + 1)
    {
      if (local_18 == local_14 - 1) {
        return local_14;
      }
    }
    local_14 = local_14 - 1;
  } while( true );
}

Assistant:

uint get_max_prime(unsigned int number) {
    for (unsigned int i = number; i >= 2; --i) {
        for (int j = 2; j < i; ++j) {
            if (i % j == 0)
                break;
            if (j == i - 1)
                return i;
        }
    }
    return 2;
}